

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

long os_get_sys_clock_ms(void)

{
  int iVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *__d;
  rep rVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffff0;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_fffffffffffffff8;
  
  if (os_get_sys_clock_ms::start == '\0') {
    iVar1 = __cxa_guard_acquire(&os_get_sys_clock_ms::start);
    if (iVar1 != 0) {
      os_get_sys_clock_ms::start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      __cxa_guard_release(&os_get_sys_clock_ms::start);
    }
  }
  __d = (duration<long,_std::ratio<1L,_1000000000L>_> *)std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffff8.__r,in_stack_fffffffffffffff0);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
            (__d);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffff8);
  return rVar2;
}

Assistant:

long
os_get_sys_clock_ms( void )
{
    using namespace std::chrono;
    static const auto start = steady_clock::now();
    return duration_cast<milliseconds>(steady_clock::now() - start).count();
}